

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O1

void Rwr_ManWriteToFile(Rwr_Man_t *p,char *pFileName)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  void *__ptr;
  FILE *__s;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int level;
  int nEntries;
  timespec ts;
  uint local_44;
  timespec local_40;
  
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pVVar1 = p->vForest;
  lVar8 = (long)pVVar1->nSize;
  local_44 = (uint)(lVar8 - 5U);
  __ptr = malloc(lVar8 * 8 - 0x28);
  if (5 < lVar8) {
    ppvVar2 = pVVar1->pArray;
    uVar7 = 0;
    do {
      pvVar3 = ppvVar2[uVar7 + 5];
      iVar5 = ((uint)*(ulong *)((long)pvVar3 + 0x18) & 1) +
              *(int *)(*(ulong *)((long)pvVar3 + 0x18) & 0xfffffffffffffffe) * 2;
      *(int *)((long)__ptr + uVar7 * 8) = iVar5;
      *(uint *)((long)__ptr + uVar7 * 8 + 4) =
           ((uint)*(ulong *)((long)pvVar3 + 0x20) & 1) +
           *(int *)(*(ulong *)((long)pvVar3 + 0x20) & 0xfffffffffffffffe) * 2;
      *(uint *)((long)__ptr + uVar7 * 8) = *(uint *)((long)pvVar3 + 0xe) >> 0x1f | iVar5 * 2;
      uVar7 = uVar7 + 1;
    } while ((lVar8 - 5U & 0xffffffff) != uVar7);
  }
  __s = fopen(pFileName,"wb");
  fwrite(&local_44,4,1,__s);
  uVar4 = local_44;
  fwrite(__ptr,4,(long)(int)local_44 * 2,__s);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  fclose(__s);
  iVar5 = 0x9ddac3;
  printf("The number of nodes saved = %d.   ",(ulong)uVar4);
  Abc_Print(iVar5,"%s =","Saving");
  level = 3;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar8 + lVar6) / 1000000.0);
  return;
}

Assistant:

void Rwr_ManWriteToFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * pNode;
    unsigned * pBuffer;
    int i, nEntries;
    abctime clk = Abc_Clock();
    // prepare the buffer
    nEntries = p->vForest->nSize - 5;
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    for ( i = 0; i < nEntries; i++ )
    {
        pNode = (Rwr_Node_t *)p->vForest->pArray[i+5];
        pBuffer[2*i + 0] = (Rwr_Regular(pNode->p0)->Id << 1) | Rwr_IsComplement(pNode->p0);
        pBuffer[2*i + 1] = (Rwr_Regular(pNode->p1)->Id << 1) | Rwr_IsComplement(pNode->p1);
        // save EXOR flag
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] << 1) | pNode->fExor;

    }
    pFile = fopen( pFileName, "wb" );
    fwrite( &nEntries, sizeof(int), 1, pFile );
    fwrite( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    ABC_FREE( pBuffer );
    fclose( pFile );
    printf( "The number of nodes saved = %d.   ", nEntries );  ABC_PRT( "Saving", Abc_Clock() - clk );
}